

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O0

bool __thiscall
CachingTransactionSignatureChecker::VerifySchnorrSignature
          (CachingTransactionSignatureChecker *this,Span<const_unsigned_char> sig,
          XOnlyPubKey *pubkey,uint256 *sighash)

{
  long lVar1;
  Span<const_unsigned_char> sig_00;
  Span<const_unsigned_char> sig_01;
  bool bVar2;
  uint256 *in_RDX;
  SignatureCache *in_RSI;
  XOnlyPubKey *in_RDI;
  GenericTransactionSignatureChecker<CTransaction> *in_R8;
  long in_FS_OFFSET;
  uint256 entry;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  XOnlyPubKey *pXVar3;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  SignatureCache *in_stack_ffffffffffffffa8;
  uint256 *in_stack_ffffffffffffffb0;
  SignatureCache *pSVar4;
  undefined1 erase;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pXVar3 = in_RDI;
  uint256::uint256((uint256 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  erase = (undefined1)((ulong)pXVar3 >> 0x38);
  sig_01.m_size = (size_t)in_RSI;
  sig_01.m_data = (uchar *)in_RDX;
  pSVar4 = in_RSI;
  SignatureCache::ComputeEntrySchnorr
            (in_RSI,in_stack_ffffffffffffffb0,(uint256 *)in_stack_ffffffffffffffa8,sig_01,
             (XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar2 = SignatureCache::Get(in_stack_ffffffffffffffa8,
                              (uint256 *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              (bool)erase);
  if (bVar2) {
    bVar2 = true;
  }
  else {
    sig_00.m_data._7_1_ = in_stack_ffffffffffffffa7;
    sig_00.m_data._0_7_ = in_stack_ffffffffffffffa0;
    sig_00.m_size = (size_t)pSVar4;
    bVar2 = GenericTransactionSignatureChecker<CTransaction>::VerifySchnorrSignature
                      (in_R8,sig_00,in_RDI,
                       (uint256 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (bVar2) {
      if ((in_RDI[1].m_keydata.super_base_blob<256U>.m_data._M_elems[8] & 1) != 0) {
        SignatureCache::Set(in_RSI,in_RDX);
      }
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CachingTransactionSignatureChecker::VerifySchnorrSignature(Span<const unsigned char> sig, const XOnlyPubKey& pubkey, const uint256& sighash) const
{
    uint256 entry;
    m_signature_cache.ComputeEntrySchnorr(entry, sighash, sig, pubkey);
    if (m_signature_cache.Get(entry, !store)) return true;
    if (!TransactionSignatureChecker::VerifySchnorrSignature(sig, pubkey, sighash)) return false;
    if (store) m_signature_cache.Set(entry);
    return true;
}